

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

InterfacePortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InterfacePortHeaderSyntax,slang::syntax::InterfacePortHeaderSyntax_const&>
          (BumpAllocator *this,InterfacePortHeaderSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  DotMemberClauseSyntax *pDVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  InterfacePortHeaderSyntax *pIVar10;
  
  pIVar10 = (InterfacePortHeaderSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InterfacePortHeaderSyntax *)this->endPtr < pIVar10 + 1) {
    pIVar10 = (InterfacePortHeaderSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pIVar10 + 1);
  }
  SVar8 = (args->super_PortHeaderSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_PortHeaderSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PortHeaderSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_PortHeaderSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->nameOrKeyword).kind;
  uVar5 = (args->nameOrKeyword).field_0x2;
  NVar6.raw = (args->nameOrKeyword).numFlags.raw;
  uVar7 = (args->nameOrKeyword).rawLen;
  pDVar3 = args->modport;
  (pIVar10->nameOrKeyword).info = (args->nameOrKeyword).info;
  pIVar10->modport = pDVar3;
  (pIVar10->super_PortHeaderSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pIVar10->nameOrKeyword).kind = TVar4;
  (pIVar10->nameOrKeyword).field_0x2 = uVar5;
  (pIVar10->nameOrKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar10->nameOrKeyword).rawLen = uVar7;
  (pIVar10->super_PortHeaderSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pIVar10->super_PortHeaderSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pIVar10->super_PortHeaderSyntax).super_SyntaxNode.parent = pSVar1;
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }